

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Federate.cpp
# Opt level: O0

void __thiscall
helics::Federate::handleError(Federate *this,int errorCode,string_view errorString,bool noThrow)

{
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view message;
  bool bVar1;
  undefined8 uVar2;
  size_t in_RCX;
  FederateError *in_RDX;
  undefined8 in_RDI;
  byte in_R8B;
  int in_stack_ffffffffffffffac;
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  int errorCode_00;
  Federate *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd0;
  
  uVar3 = (undefined4)in_RDI;
  errorCode_00 = (int)((ulong)in_RDI >> 0x20);
  updateFederateMode(in_stack_ffffffffffffffc0,(Modes)((ulong)in_RDI >> 0x38));
  bVar1 = std::function::operator_cast_to_bool
                    ((function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)> *)
                     0x21e8a5);
  if (bVar1) {
    __args_1._M_len._4_4_ = errorCode_00;
    __args_1._M_len._0_4_ = uVar3;
    __args_1._M_str = (char *)in_stack_ffffffffffffffc0;
    std::function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>)>::operator()
              (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac,__args_1);
  }
  else if ((in_R8B & 1) == 0) {
    uVar2 = __cxa_allocate_exception(0x30);
    message._M_str = in_stack_ffffffffffffffd0;
    message._M_len = in_RCX;
    FederateError::FederateError(in_RDX,errorCode_00,message);
    __cxa_throw(uVar2,&FederateError::typeinfo,FederateError::~FederateError);
  }
  return;
}

Assistant:

void Federate::handleError(int errorCode, std::string_view errorString, bool noThrow)
{
    updateFederateMode(Modes::ERROR_STATE);

    if (errorHandlerCallback) {
        errorHandlerCallback(errorCode, errorString);
    } else if (!noThrow) {
        throw FederateError(errorCode, errorString);
    }
}